

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

_Bool bson_iter_init_find(bson_iter_t *iter,bson_t *bson,char *key)

{
  _Bool _Var1;
  uint8_t *puVar2;
  bson_iter_t *unaff_RBX;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_cold_3();
LAB_001106ab:
    bson_iter_init_find_cold_2();
  }
  else {
    if (bson == (bson_t *)0x0) goto LAB_001106ab;
    if (key != (char *)0x0) {
      unaff_RBX = iter;
      if (4 < bson->len) {
        puVar2 = bson_get_data(bson);
        iter->raw = puVar2;
        iter->len = bson->len;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->next_off = 4;
        iter->err_off = 0;
        _Var1 = _bson_iter_find_with_len(iter,key,-1);
        return _Var1;
      }
      goto LAB_001106b5;
    }
  }
  bson_iter_init_find_cold_1();
LAB_001106b5:
  (unaff_RBX->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_RBX->value).value + 0x10) = 0;
  (unaff_RBX->value).value_type = BSON_TYPE_EOD;
  (unaff_RBX->value).padding = 0;
  (unaff_RBX->value).value.v_int64 = 0;
  unaff_RBX->d3 = 0;
  unaff_RBX->d4 = 0;
  unaff_RBX->next_off = 0;
  unaff_RBX->err_off = 0;
  unaff_RBX->type = 0;
  unaff_RBX->key = 0;
  unaff_RBX->d1 = 0;
  unaff_RBX->d2 = 0;
  unaff_RBX->raw = (uint8_t *)0x0;
  unaff_RBX->len = 0;
  unaff_RBX->off = 0;
  return false;
}

Assistant:

bool
bson_iter_init_find (bson_iter_t *iter,  /* INOUT */
                     const bson_t *bson, /* IN */
                     const char *key)    /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   return bson_iter_init (iter, bson) && bson_iter_find (iter, key);
}